

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

void __thiscall QDialogPrivate::~QDialogPrivate(QDialogPrivate *this)

{
  QDialogPrivate *in_RDI;
  
  ~QDialogPrivate(in_RDI);
  operator_delete(in_RDI,0x2e0);
  return;
}

Assistant:

QDialogPrivate::~QDialogPrivate()
{
    delete m_platformHelper;
}